

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# private_impl.cpp
# Opt level: O0

void __thiscall raspicam::_private::Private_Impl::setDefaultStateParams(Private_Impl *this)

{
  long in_RDI;
  
  memset((void *)(in_RDI + 8),0,0xc0);
  *(undefined4 *)(in_RDI + 0x10) = 0x1e;
  *(undefined4 *)(in_RDI + 8) = 0x500;
  *(undefined4 *)(in_RDI + 0xc) = 0x3c0;
  *(undefined4 *)(in_RDI + 0x28) = 0;
  *(undefined4 *)(in_RDI + 0x2c) = 0;
  *(undefined4 *)(in_RDI + 0x30) = 0x32;
  *(undefined4 *)(in_RDI + 0x34) = 0;
  *(undefined4 *)(in_RDI + 0x38) = 400;
  *(undefined1 *)(in_RDI + 0x3c) = 0;
  *(undefined4 *)(in_RDI + 0x40) = 0;
  *(undefined4 *)(in_RDI + 0x48) = 3;
  *(undefined4 *)(in_RDI + 0x4c) = 1;
  *(undefined4 *)(in_RDI + 0x50) = 0;
  *(undefined4 *)(in_RDI + 0x54) = 1;
  *(undefined4 *)(in_RDI + 0x58) = 0;
  *(undefined4 *)(in_RDI + 0x84) = 0;
  *(undefined4 *)(in_RDI + 0x88) = 0x80;
  *(undefined4 *)(in_RDI + 0x8c) = 0x80;
  *(undefined4 *)(in_RDI + 0x90) = 0;
  *(undefined4 *)(in_RDI + 0x98) = 0;
  *(undefined4 *)(in_RDI + 0x94) = 0;
  *(undefined8 *)(in_RDI + 0xa8) = 0;
  *(undefined8 *)(in_RDI + 0xa0) = 0;
  *(undefined8 *)(in_RDI + 0xb8) = 0x3ff0000000000000;
  *(undefined8 *)(in_RDI + 0xb0) = 0x3ff0000000000000;
  *(undefined4 *)(in_RDI + 0x44) = 0;
  *(undefined4 *)(in_RDI + 0xc0) = 0x3f800000;
  *(undefined4 *)(in_RDI + 0xc4) = 0x3f800000;
  return;
}

Assistant:

void Private_Impl::setDefaultStateParams() {

            // Default everything to zero
            memset ( &State, 0, sizeof ( RASPIVID_STATE ) );
            State.framerate 		= 30;
            State.width 			= 1280;      // use a multiple of 320 (640, 1280)
            State.height 			= 960;		// use a multiple of 240 (480, 960)
            State.sharpness = 0;
            State.contrast = 0;
            State.brightness = 50;
            State.saturation = 0;
            State.ISO = 400;
            State.videoStabilisation = false;
            State.exposureCompensation = 0;
            State.captureFtm=RASPICAM_FORMAT_RGB;
            State.rpc_exposureMode = RASPICAM_EXPOSURE_AUTO;
            State.rpc_exposureMeterMode = RASPICAM_METERING_AVERAGE;
            State.rpc_awbMode = RASPICAM_AWB_AUTO;
            State.rpc_imageEffect = RASPICAM_IMAGE_EFFECT_NONE;
            State.colourEffects.enable = 0;
            State.colourEffects.u = 128;
            State.colourEffects.v = 128;
            State.rotation = 0;
            State.hflip = State.vflip = 0;
            State.roi.x = State.roi.y = 0.0;
            State.roi.w = State.roi.h = 1.0;
            State.shutterSpeed=0;//auto
            State.awbg_red=1.0;
            State.awbg_blue=1.0;

        }